

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

wstring * __thiscall
PDA::Transducer::Token::vectorToWString_abi_cxx11_
          (wstring *__return_storage_ptr__,Token *this,
          vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *src)

{
  long lVar1;
  Token *token;
  long lVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  lVar2._0_4_ = this->token;
  lVar2._4_4_ = this->position;
  lVar1._0_4_ = this->line;
  lVar1._4_4_ = this->fileIndex;
  for (; lVar2 != lVar1; lVar2 = lVar2 + 0x14) {
    std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring Token::vectorToWString(const std::vector<Token> &src)
{
    std::wstring result;
    for (const Token &token : src)
        result += token.token;
    return result;
}